

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::TriangleDraw::Run(TriangleDraw *this)

{
  CallLogWrapper *this_00;
  GLuint *arrays;
  ulong uVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  undefined8 src_vs;
  bool bVar5;
  GLuint GVar6;
  void *__s;
  ulong uVar7;
  ulong uVar8;
  bool *compile_error;
  long lVar9;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  GLenum drawBuffer;
  float local_88;
  float afStack_84 [7];
  GLfloat buffData [16];
  GLfloat colorf [4];
  
  this_00 = &(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->fbo);
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&this->rbo);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,this->rbo);
  glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x8d70,100,100);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,this->rbo);
  drawBuffer = 0x8ce0;
  glu::CallLogWrapper::glDrawBuffers(this_00,1,&drawBuffer);
  colorf[0] = 0.0;
  colorf[1] = 0.0;
  colorf[2] = 0.0;
  colorf[3] = 0.0;
  glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,colorf);
  glu::CallLogWrapper::glViewport(this_00,0,0,100,100);
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1b])
            (buffData,this);
  src_vs = buffData._0_8_;
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1c])
            (&data,this);
  GVar6 = TGBase::CreateProgram
                    ((TGBase *)this,(char *)src_vs,
                     (char *)data.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  this->program = GVar6;
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((GLfloat *)buffData._0_8_ != buffData + 4) {
    operator_delete((void *)buffData._0_8_,buffData._16_8_ + 1);
  }
  glu::CallLogWrapper::glBindAttribLocation(this_00,this->program,0,"Vertex");
  glu::CallLogWrapper::glLinkProgram(this_00,this->program);
  bVar5 = TGBase::CheckProgram((TGBase *)this,this->program,compile_error);
  lVar9 = -1;
  if (bVar5) {
    glu::CallLogWrapper::glUseProgram(this_00,this->program);
    glu::CallLogWrapper::glGenTextures(this_00,1,&(this->super_GatherBase).tex);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,(this->super_GatherBase).tex);
    buffData[0] = 0.25;
    buffData[1] = 0.5;
    buffData[2] = 0.75;
    buffData[3] = 1.0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&data,10000,(value_type *)buffData,(allocator_type *)&local_88);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8814,100,100,0,0x1908,0x1406,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x8072,0x812f);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    arrays = &this->vao;
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,arrays);
    glu::CallLogWrapper::glBindVertexArray(this_00,*arrays);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->vbo);
    buffData[0xc] = 1.0;
    buffData[0xd] = -1.0;
    buffData[0xe] = 0.0;
    buffData[0xf] = 1.0;
    buffData[8] = 1.0;
    buffData[9] = 1.0;
    buffData[10] = 0.0;
    buffData[0xb] = 1.0;
    buffData[4] = -1.0;
    buffData[5] = -1.0;
    buffData[6] = 0.0;
    buffData[7] = 1.0;
    buffData[0] = -1.0;
    buffData[1] = 1.0;
    buffData[2] = 0.0;
    buffData[3] = 1.0;
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x40,buffData,0x88e4);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    glu::CallLogWrapper::glDisableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,arrays);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
    __s = operator_new(160000);
    memset(__s,0,160000);
    glu::CallLogWrapper::glReadPixels(this_00,0,0,100,100,0x8d99,0x1405,__s);
    lVar9 = 0;
    uVar7 = 0;
    do {
      pfVar2 = (float *)((long)__s + uVar7 * 4);
      local_88 = *pfVar2;
      afStack_84[0] = pfVar2[1];
      afStack_84[1] = pfVar2[2];
      afStack_84[2] = pfVar2[3];
      afStack_84[3] = 0.75;
      afStack_84[4] = 0.75;
      afStack_84[5] = 0.75;
      afStack_84[6] = 0.75;
      if ((local_88 != 0.75) || (NAN(local_88))) {
LAB_00c02a2b:
        anon_unknown_0::Output
                  ("Got: %f %f %f %f, expected vec4(0.75)",SUB84((double)local_88,0),
                   (double)pfVar2[1],(double)pfVar2[2],SUB84((double)pfVar2[3],0));
        lVar9 = -1;
        break;
      }
      uVar8 = 0xffffffffffffffff;
      do {
        if (uVar8 == 2) goto LAB_00c02a1a;
        lVar4 = uVar8 + 1;
        uVar1 = uVar8 + 1;
        lVar3 = uVar8 - 2;
      } while ((afStack_84[lVar4] == buffData[lVar3]) &&
              (uVar8 = uVar1, !NAN(afStack_84[lVar4]) && !NAN(buffData[lVar3])));
      if (uVar1 < 3) goto LAB_00c02a2b;
LAB_00c02a1a:
      bVar5 = uVar7 < 0x270c;
      uVar7 = uVar7 + 4;
    } while (bVar5);
    operator_delete(__s,160000);
    if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return lVar9;
}

Assistant:

virtual long Run()
	{
		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);
		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA32UI, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		GLenum drawBuffer = GL_COLOR_ATTACHMENT0;
		glDrawBuffers(1, &drawBuffer);
		GLfloat colorf[4] = { 0, 0, 0, 0 };
		glClearBufferfv(GL_COLOR, 0, colorf);
		glViewport(0, 0, 100, 100);

		program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str());
		glBindAttribLocation(program, 0, "Vertex");
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		glUseProgram(program);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		std::vector<Vec4> data(100 * 100, Vec4(0.25, 0.5, 0.75, 1));
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 100, 100, 0, GL_RGBA, GL_FLOAT, &data[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		GLfloat buffData[16] = { -1, 1, 0, 1, -1, -1, 0, 1, 1, 1, 0, 1, 1, -1, 0, 1 };
		glBufferData(GL_ARRAY_BUFFER, sizeof(buffData), buffData, GL_STATIC_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(GLfloat) * 4, 0);
		glEnableVertexAttribArray(0);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glDisableVertexAttribArray(0);
		glDeleteVertexArrays(1, &vao);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glReadBuffer(GL_COLOR_ATTACHMENT0);
		std::vector<unsigned int> read(100 * 100 * 4, 0);
		glReadPixels(0, 0, 100, 100, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &read[0]);
		for (unsigned int i = 0; i < read.size() / 4; i += 4)
		{
			const GLfloat* rdata = (const GLfloat*)&read[i];
			Vec4		   rvec(rdata[0], rdata[1], rdata[2], rdata[3]);
			if (rvec != Vec4(0.75))
			{
				Output("Got: %f %f %f %f, expected vec4(0.75)", rvec.x(), rvec.y(), rvec.z(), rvec.w());
				return ERROR;
			}
		}

		return NO_ERROR;
	}